

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::addConstructor
          (TParseContext *this,TSourceLoc *loc,TIntermNode *node,TType *type)

{
  TIntermNode *node_00;
  char cVar1;
  int iVar2;
  TOperator op;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *node_01;
  undefined4 extraout_var_02;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar8;
  TTypeList *pTVar9;
  TSourceLoc *loc_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TType *pTVar10;
  undefined8 *puVar11;
  byte bVar12;
  byte local_1a9;
  pointer local_190;
  TType elementType;
  char *specConstantCompositeExt [1];
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  
  if (node == (TIntermNode *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
            (this,loc,"constructor",CONCAT44(extraout_var_00,iVar2));
  iVar2 = (*node->_vptr_TIntermNode[6])(node);
  node_01 = (TIntermNode *)CONCAT44(extraout_var_01,iVar2);
  op = TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (node_01 != (TIntermNode *)0x0 && op == EOpConstructTextureSampler) {
    iVar2 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
    plVar6 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) + 8) +
                                 0x18))();
    plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))(plVar6);
    lVar7 = (**(code **)(*plVar6 + 0x40))(plVar6);
    if ((*(byte *)(lVar7 + 2) & 2) != 0) {
      iVar2 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
      plVar6 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_03,iVar2) + 8)
                                   + 0x18))();
      plVar6 = (long *)(**(code **)(*plVar6 + 0xf8))(plVar6);
      lVar7 = (**(code **)(*plVar6 + 0x48))(plVar6);
      *(byte *)(lVar7 + 2) = *(byte *)(lVar7 + 2) | 2;
    }
    pTVar8 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,node_01,
                        EOpConstructTextureSampler,type,loc);
    return pTVar8;
  }
  if (op == EOpConstructStruct) {
    pTVar9 = TType::getStruct(type);
    local_190 = (pTVar9->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_190 = (pointer)0x0;
  }
  TType::TType(&elementType,EbtVoid,EvqTemporary,1,0,0,false);
  iVar2 = (*type->_vptr_TType[0x1d])();
  pTVar10 = type;
  if ((char)iVar2 != '\0') {
    TType::TType((TType *)specConstantCompositeExt,type,0,false);
    pTVar10 = (TType *)specConstantCompositeExt;
  }
  TType::shallowCopy(&elementType,pTVar10);
  if ((node_01 != (TIntermNode *)0x0) && (node_01[5].loc.column == 0)) {
    iVar5 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
    puVar11 = *(undefined8 **)(CONCAT44(extraout_var_06,iVar5) + 8);
    local_1a9 = 1;
    iVar2 = 1;
    bVar12 = 0;
    for (; puVar11 != *(undefined8 **)(CONCAT44(extraout_var_06,iVar5) + 0x10);
        puVar11 = puVar11 + 1) {
      iVar3 = (*type->_vptr_TType[0x1d])();
      node_00 = (TIntermNode *)*puVar11;
      if ((char)iVar3 == '\0') {
        if (op == EOpConstructStruct) {
          pTVar10 = local_190->type;
          iVar3 = (**node->_vptr_TIntermNode)(node);
          pTVar8 = constructAggregate(this,node_00,pTVar10,iVar2,
                                      (TSourceLoc *)CONCAT44(extraout_var_08,iVar3));
        }
        else {
          iVar3 = (*node_00->_vptr_TIntermNode[3])(node_00);
          iVar4 = (**node->_vptr_TIntermNode)(node);
          pTVar8 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_09,iVar3),
                                    (TSourceLoc *)CONCAT44(extraout_var_10,iVar4),true);
        }
      }
      else {
        iVar3 = (**node->_vptr_TIntermNode)(node);
        pTVar8 = constructAggregate(this,node_00,&elementType,iVar2,
                                    (TSourceLoc *)CONCAT44(extraout_var_07,iVar3));
      }
      if (pTVar8 == (TIntermTyped *)0x0) {
        return (TIntermTyped *)0x0;
      }
      *puVar11 = pTVar8;
      iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_11,iVar3));
      local_1a9 = local_1a9 &
                  ((*(ulong *)(lVar7 + 8) & 0x100000000) != 0 ||
                  (*(ulong *)(lVar7 + 8) & 0x10000007f) == 2);
      iVar3 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar3) + 0x58))
                        ((long *)CONCAT44(extraout_var_12,iVar3));
      bVar12 = bVar12 | (*(ulong *)(lVar7 + 8) & 0x100000000) != 0;
      iVar2 = iVar2 + 1;
      local_190 = local_190 + 1;
    }
    pTVar8 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,node_01,op
                        ,type,loc);
    specConstantCompositeExt[0] = "GL_EXT_spec_constant_composites";
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0xc])
                      (this,loc,1,specConstantCompositeExt,"spec constant aggregate constructor");
    if ((byte)(local_1a9 & bVar12 & (byte)iVar2) == 1) {
      iVar2 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
      lVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_15,iVar2));
      *(ulong *)(lVar7 + 8) = (*(ulong *)(lVar7 + 8) & 0xfffffffeffffff80) + 0x100000002;
    }
    iVar2 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[6])(pTVar8);
    plVar6 = (long *)CONCAT44(extraout_var_16,iVar2);
    if (plVar6 != (long *)0x0) {
      cVar1 = (**(code **)(*plVar6 + 0x158))(plVar6);
      if (((cVar1 == '\0') && (cVar1 = (**(code **)(*plVar6 + 0x150))(plVar6), cVar1 == '\0')) &&
         (cVar1 = (**(code **)(*plVar6 + 0x148))(plVar6), cVar1 == '\0')) {
        return pTVar8;
      }
      (**(code **)(*plVar6 + 0x180))(plVar6);
      return pTVar8;
    }
    return pTVar8;
  }
  iVar2 = (*type->_vptr_TType[0x1d])();
  if ((char)iVar2 == '\0') {
    if (op != EOpConstructStruct) {
      iVar2 = (*node->_vptr_TIntermNode[3])(node);
      iVar5 = (**node->_vptr_TIntermNode)(node);
      pTVar8 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_13,iVar2),
                                (TSourceLoc *)CONCAT44(extraout_var_14,iVar5),false);
      goto LAB_0040e80c;
    }
    pTVar10 = local_190->type;
    iVar2 = (**node->_vptr_TIntermNode)(node);
    loc_00 = (TSourceLoc *)CONCAT44(extraout_var_05,iVar2);
  }
  else {
    iVar2 = (**node->_vptr_TIntermNode)(node);
    loc_00 = (TSourceLoc *)CONCAT44(extraout_var_04,iVar2);
    pTVar10 = &elementType;
  }
  pTVar8 = constructAggregate(this,node,pTVar10,1,loc_00);
LAB_0040e80c:
  if (pTVar8 == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*type->_vptr_TType[0x1d])();
  if ((op != EOpConstructStruct) && ((char)iVar2 == '\0')) {
    return pTVar8;
  }
  pTVar8 = TIntermediate::setAggregateOperator
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      &pTVar8->super_TIntermNode,EOpConstructStruct,type,loc);
  return pTVar8;
}

Assistant:

TIntermTyped* TParseContext::addConstructor(const TSourceLoc& loc, TIntermNode* node, const TType& type)
{
    if (node == nullptr || node->getAsTyped() == nullptr)
        return nullptr;
    rValueErrorCheck(loc, "constructor", node->getAsTyped());

    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    // Combined texture-sampler constructors are completely semantic checked
    // in constructorTextureSamplerError()
    if (op == EOpConstructTextureSampler) {
        if (aggrNode != nullptr) {
            if (aggrNode->getSequence()[1]->getAsTyped()->getType().getSampler().shadow) {
                // Transfer depth into the texture (SPIR-V image) type, as a hint
                // for tools to know this texture/image is a depth image.
                aggrNode->getSequence()[0]->getAsTyped()->getWritableType().getSampler().shadow = true;
            }
            return intermediate.setAggregateOperator(aggrNode, op, type, loc);
        }
    }

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // If structure constructor or array constructor is being called
        // for only one parameter inside the structure, we need to call constructAggregate function once.
        if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, node->getAsTyped(), node->getLoc(), false);

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence &sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps track of the constructor parameter number being checked

    // We don't know "top down" whether type is a specialization constant,
    // but a const becomes a specialization constant if any of its children are.
    bool hasSpecConst = false;
    bool isConstConstructor = true;

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.
    for (TIntermSequence::iterator p = sequenceVector.begin();
                                   p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount+1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount+1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode) {
            *p = newNode;
            if (!newNode->getType().getQualifier().isConstant())
                isConstConstructor = false;
            if (newNode->getType().getQualifier().isSpecConstant())
                hasSpecConst = true;
        } else
            return nullptr;
    }

    TIntermTyped* ret_node = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    const char *specConstantCompositeExt[] = { E_GL_EXT_spec_constant_composites };
    if (checkExtensionsRequested(loc, 1, specConstantCompositeExt, "spec constant aggregate constructor")) {
        if (isConstConstructor && hasSpecConst) {
            ret_node->getWritableType().getQualifier().makeSpecConstant();
        }
    }

    TIntermAggregate *agg_node = ret_node->getAsAggregate();
    if (agg_node && (agg_node->isVector() || agg_node->isArray() || agg_node->isMatrix()))
        agg_node->updatePrecision();

    return ret_node;
}